

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O3

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  TestPartResultReporterInterface **ppTVar1;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_0014e090;
  this->has_new_fatal_failure_ = false;
  UnitTest::GetInstance();
  ppTVar1 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&(UnitTest::GetInstance::instance.impl_)->
                        per_thread_test_part_result_reporter_);
  this->original_reporter_ = *ppTVar1;
  UnitTest::GetInstance();
  ppTVar1 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&(UnitTest::GetInstance::instance.impl_)->
                        per_thread_test_part_result_reporter_);
  *ppTVar1 = &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}